

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_3c4::NinjaMain::DumpMetrics(NinjaMain *this)

{
  size_type sVar1;
  size_type sVar2;
  int buckets;
  int count;
  NinjaMain *this_local;
  
  Metrics::Report(g_metrics);
  printf("\n");
  sVar1 = std::
          unordered_map<StringPiece,_Node_*,_std::hash<StringPiece>,_std::equal_to<StringPiece>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>_>
          ::size(&(this->state_).paths_);
  sVar2 = std::
          unordered_map<StringPiece,_Node_*,_std::hash<StringPiece>,_std::equal_to<StringPiece>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>_>
          ::bucket_count(&(this->state_).paths_);
  printf("path->node hash load %.2f (%d entries / %d buckets)\n",
         (double)(int)sVar1 / (double)(int)sVar2,sVar1 & 0xffffffff,sVar2 & 0xffffffff);
  return;
}

Assistant:

void NinjaMain::DumpMetrics() {
  g_metrics->Report();

  printf("\n");
  int count = (int)state_.paths_.size();
  int buckets = (int)state_.paths_.bucket_count();
  printf("path->node hash load %.2f (%d entries / %d buckets)\n",
         count / (double) buckets, count, buckets);
}